

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::SwapElements
          (RepeatedField<absl::lts_20250127::Cord> *this,int index1,int index2)

{
  cordz_info_t cVar1;
  CordRep *pCVar2;
  CordRep *pCVar3;
  Cord *pCVar4;
  
  pCVar4 = elements(this,(undefined1  [16])
                         ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
  if (index2 != index1) {
    cVar1 = pCVar4[index2].contents_.data_.rep_.field_0.as_tree.cordz_info;
    pCVar2 = pCVar4[index2].contents_.data_.rep_.field_0.as_tree.rep;
    pCVar3 = pCVar4[index1].contents_.data_.rep_.field_0.as_tree.rep;
    pCVar4[index2].contents_.data_.rep_.field_0.as_tree.cordz_info =
         pCVar4[index1].contents_.data_.rep_.field_0.as_tree.cordz_info;
    pCVar4[index2].contents_.data_.rep_.field_0.as_tree.rep = pCVar3;
    pCVar4[index1].contents_.data_.rep_.field_0.as_tree.cordz_info = cVar1;
    pCVar4[index1].contents_.data_.rep_.field_0.as_tree.rep = pCVar2;
  }
  return;
}

Assistant:

void RepeatedField<Element>::SwapElements(int index1, int index2) {
  Element* elem = elements(is_soo());
  using std::swap;  // enable ADL with fallback
  swap(elem[index1], elem[index2]);
}